

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,Benchmark *other)

{
  BenchmarkImp *pBVar1;
  pointer pcVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  undefined2 uVar6;
  BigO BVar7;
  undefined4 uVar8;
  TimeUnit TVar9;
  int iVar10;
  BenchmarkImp *pBVar11;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_001417e8;
  pBVar11 = (BenchmarkImp *)operator_new(0x80);
  pBVar1 = other->imp_;
  (pBVar11->name_)._M_dataplus._M_p = (pointer)&(pBVar11->name_).field_2;
  pcVar2 = (pBVar1->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pBVar11,pcVar2,pcVar2 + (pBVar1->name_)._M_string_length);
  pBVar11->report_mode_ = pBVar1->report_mode_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&pBVar11->args_,&pBVar1->args_);
  pBVar11->complexity_lambda_ = pBVar1->complexity_lambda_;
  TVar9 = pBVar1->time_unit_;
  iVar10 = pBVar1->range_multiplier_;
  dVar3 = pBVar1->min_time_;
  bVar4 = pBVar1->use_real_time_;
  bVar5 = pBVar1->use_manual_time_;
  uVar6 = *(undefined2 *)&pBVar1->field_0x56;
  BVar7 = pBVar1->complexity_;
  uVar8 = *(undefined4 *)&pBVar1->field_0x5c;
  pBVar11->repetitions_ = pBVar1->repetitions_;
  pBVar11->use_real_time_ = bVar4;
  pBVar11->use_manual_time_ = bVar5;
  *(undefined2 *)&pBVar11->field_0x56 = uVar6;
  pBVar11->complexity_ = BVar7;
  *(undefined4 *)&pBVar11->field_0x5c = uVar8;
  pBVar11->time_unit_ = TVar9;
  pBVar11->range_multiplier_ = iVar10;
  pBVar11->min_time_ = dVar3;
  std::vector<int,_std::allocator<int>_>::vector(&pBVar11->thread_counts_,&pBVar1->thread_counts_);
  this->imp_ = pBVar11;
  return;
}

Assistant:

Benchmark::Benchmark(Benchmark const& other)
  : imp_(new BenchmarkImp(*other.imp_))
{
}